

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tags.hpp
# Opt level: O0

InLineIfTag * __thiscall Qentem::Tags::TagBit::MakeInLineIfTag(TagBit *this)

{
  InLineIfTag *pIVar1;
  InLineIfTag *tag;
  TagBit *this_local;
  
  pIVar1 = Memory::AllocateInit<Qentem::Tags::InLineIfTag>();
  this->type_ = InLineIf;
  this->storage_ = pIVar1;
  return pIVar1;
}

Assistant:

InLineIfTag *MakeInLineIfTag() {
        InLineIfTag *tag = Memory::AllocateInit<InLineIfTag>();

        type_    = TagType::InLineIf;
        storage_ = tag;

        return tag;
    }